

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O0

void __thiscall QSaveFile::QSaveFile(QSaveFile *this,QString *name)

{
  QSaveFilePrivate *this_00;
  QString *in_RDI;
  QSaveFilePrivate *d;
  QFileDevicePrivate *in_stack_ffffffffffffffd8;
  QFileDevice *in_stack_ffffffffffffffe0;
  
  this_00 = (QSaveFilePrivate *)operator_new(0x1e0);
  QSaveFilePrivate::QSaveFilePrivate(this_00);
  QFileDevice::QFileDevice(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(QObject *)this_00);
  (in_RDI->d).d = (Data *)&PTR_metaObject_00be3b88;
  d_func((QSaveFile *)0x2ef880);
  QString::operator=((QString *)this_00,in_RDI);
  return;
}

Assistant:

QSaveFile::QSaveFile(const QString &name)
    : QFileDevice(*new QSaveFilePrivate, nullptr)
{
    Q_D(QSaveFile);
    d->fileName = name;
}